

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

void Bbl_ManSimpleDemo(void)

{
  Bbl_Man_t *p_00;
  Bbl_Man_t *p;
  
  p_00 = Bbl_ManStart("hadder");
  Bbl_ManCreateObject(p_00,BBL_OBJ_CI,1,0,(char *)0x0);
  Bbl_ManCreateObject(p_00,BBL_OBJ_CI,2,0,(char *)0x0);
  Bbl_ManCreateObject(p_00,BBL_OBJ_CI,3,0,(char *)0x0);
  Bbl_ManCreateObject(p_00,BBL_OBJ_CO,4,1,(char *)0x0);
  Bbl_ManCreateObject(p_00,BBL_OBJ_CO,5,1,(char *)0x0);
  Bbl_ManCreateObject(p_00,BBL_OBJ_NODE,6,3,"100 1\n010 1\n001 1\n111 1\n");
  Bbl_ManCreateObject(p_00,BBL_OBJ_NODE,7,3,"-11 1\n1-1 1\n11- 1\n");
  Bbl_ManAddFanin(p_00,6,1);
  Bbl_ManAddFanin(p_00,6,2);
  Bbl_ManAddFanin(p_00,6,3);
  Bbl_ManAddFanin(p_00,7,1);
  Bbl_ManAddFanin(p_00,7,2);
  Bbl_ManAddFanin(p_00,7,3);
  Bbl_ManAddFanin(p_00,4,6);
  Bbl_ManAddFanin(p_00,5,7);
  Bbl_ManCheck(p_00);
  Bbl_ManDumpBlif(p_00,"hadder.blif");
  Bbl_ManDumpBinaryBlif(p_00,"hadder.bblif");
  Bbl_ManStop(p_00);
  return;
}

Assistant:

void Bbl_ManSimpleDemo()
{
/*
    # There are contents of a BLIF file representing a half-adder:
    .model hadder
    .inputs a     // ID = 1
    .inputs b     // ID = 2
    .inputs cin   // ID = 3
    .outputs s    // ID = 4
    .outputs cout // ID = 5
    .names a b cin s_driver   // ID = 6
    100 1
    010 1
    001 1
    111 1
    .names a b cin cout_driver // ID = 7
    -11 1
    1-1 1
    11- 1
    .names s_driver s
    1 1
    .names cout_driver cout
    1 1
    .end
*/
    Bbl_Man_t * p;
    // start the data manager
    p = Bbl_ManStart( "hadder" );
    // create CIs
    Bbl_ManCreateObject( p, BBL_OBJ_CI, 1, 0, NULL ); // a
    Bbl_ManCreateObject( p, BBL_OBJ_CI, 2, 0, NULL ); // b
    Bbl_ManCreateObject( p, BBL_OBJ_CI, 3, 0, NULL ); // cin
    // create COs
    Bbl_ManCreateObject( p, BBL_OBJ_CO, 4, 1, NULL ); // s
    Bbl_ManCreateObject( p, BBL_OBJ_CO, 5, 1, NULL ); // cout
    // create internal nodes
    Bbl_ManCreateObject( p, BBL_OBJ_NODE, 6, 3, "100 1\n010 1\n001 1\n111 1\n" ); // s_driver
    Bbl_ManCreateObject( p, BBL_OBJ_NODE, 7, 3, "-11 1\n1-1 1\n11- 1\n" );        // cout_driver
    // add fanins of node 6
    Bbl_ManAddFanin( p, 6, 1 ); // s_driver <- a
    Bbl_ManAddFanin( p, 6, 2 ); // s_driver <- b
    Bbl_ManAddFanin( p, 6, 3 ); // s_driver <- cin
    // add fanins of node 7
    Bbl_ManAddFanin( p, 7, 1 ); // cout_driver <- a
    Bbl_ManAddFanin( p, 7, 2 ); // cout_driver <- b
    Bbl_ManAddFanin( p, 7, 3 ); // cout_driver <- cin
    // add fanins of COs
    Bbl_ManAddFanin( p, 4, 6 ); // s <- s_driver
    Bbl_ManAddFanin( p, 5, 7 ); // cout <- cout_driver
    // sanity check
    Bbl_ManCheck( p );
    // write BLIF file as a sanity check
    Bbl_ManDumpBlif( p, "hadder.blif" );
    // write binary BLIF file
    Bbl_ManDumpBinaryBlif( p, "hadder.bblif" );
    // remove the manager
    Bbl_ManStop( p );


//    Bbl_ManTestTruth( "100 1\n010 1\n001 1\n111 1\n", 3 );
//    Bbl_ManTestTruth( "-11 0\n1-1 0\n11- 0\n", 3 );
//    Bbl_ManTestTruth( "--- 1\n", 3 );
}